

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void searchtest(void)

{
  search234_state ss_00;
  char *pcVar1;
  ulong uVar2;
  tree234 *t;
  search234_state ss;
  char *expected [60];
  char directionbuf [600];
  search234_state local_480;
  char *local_458 [60];
  char local_278 [608];
  
  if (verbose != 0) {
    printf("beginning searchtest:");
  }
  uVar2 = 0;
  t = tree;
  while( true ) {
    pcVar1 = (char *)index234(t,(int)uVar2);
    if (pcVar1 == (char *)0x0) break;
    local_458[uVar2] = pcVar1;
    if (verbose != 0) {
      printf(" %d=%s",uVar2 & 0xffffffff,pcVar1);
      t = tree;
    }
    uVar2 = uVar2 + 1;
  }
  if (verbose != 0) {
    printf(" count=%d\n",uVar2 & 0xffffffff);
    t = tree;
  }
  search234_start(&local_480,t);
  ss_00.index = local_480.index;
  ss_00._lo = local_480._lo;
  ss_00.element = local_480.element;
  ss_00._hi = local_480._hi;
  ss_00._last = local_480._last;
  ss_00._base = local_480._base;
  ss_00._28_4_ = local_480._28_4_;
  ss_00._node = local_480._node;
  searchtest_recurse(ss_00,0,(int)uVar2,local_458,local_278,local_278);
  return;
}

Assistant:

void searchtest(void)
{
    char *expected[NSTR], *p;
    char directionbuf[NSTR * 10];
    int n;
    search234_state ss;

    if (verbose)
        printf("beginning searchtest:");
    for (n = 0; (p = index234(tree, n)) != NULL; n++) {
        expected[n] = p;
        if (verbose)
            printf(" %d=%s", n, p);
    }
    if (verbose)
        printf(" count=%d\n", n);

    search234_start(&ss, tree);
    searchtest_recurse(ss, 0, n, expected, directionbuf, directionbuf);
}